

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ab_algorithm.c
# Opt level: O0

void aba_c(void)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int *piVar4;
  long lVar5;
  double d;
  int k;
  int joint_type_2;
  kcc_joint *joint_2;
  int i_2;
  int joint_type_1;
  kcc_joint *joint_1;
  int i_1;
  int joint_type;
  kcc_joint *joint;
  int local_148;
  int i;
  solver_state_c s;
  kcc_kinematic_chain *kc;
  
  s.tau_ctrl = (joint_torque *)&two_dof_robot_c;
  setup_simple_state_c(&two_dof_robot_c,&local_148);
  (s.xdd)->angular_acceleration = (vector3 *)0x3ff0000000000000;
  (s.xdd)->linear_acceleration = (vector3 *)0x3ff0000000000000;
  *s.q = 1.0;
  s.q[1] = 1.0;
  *(undefined8 *)s.tau_ff_art[(long)(local_148 + -1) * 2 + 1] = 0x3ff0000000000000;
  *(undefined8 *)((long)s.tau_ff_art[(long)(local_148 + -1) * 2 + 1] + 8) = 0x3ff0000000000000;
  *(undefined8 *)((long)s.tau_ff_art[(long)(local_148 + -1) * 2 + 1] + 0x10) = 0x3ff0000000000000;
  *s.tau_bias_art = 1.0;
  s.tau_bias_art[1] = 1.0;
  ((s.xdd_nact)->linear_acceleration->field_0).field_0.z = 9.81;
  for (joint._4_4_ = 1; joint._4_4_ < local_148 + 1; joint._4_4_ = joint._4_4_ + 1) {
    piVar4 = (int *)((long)s.tau_ctrl[1] + (long)(joint._4_4_ + -1) * 0x90 + 0x10);
    iVar3 = *piVar4;
    (**(code **)(&kcc_joint + (long)iVar3 * 0x40))
              (piVar4,&(s.xdd)->angular_acceleration + (joint._4_4_ + -1),
               s._8_8_ + (long)(joint._4_4_ + -1) * 0x10);
    gc_pose_compose(s._8_8_ + (long)(joint._4_4_ + -1) * 0x10,
                    (long)s.tau_ctrl[1] + (long)(joint._4_4_ + -1) * 0x90,
                    s.x_jnt + (joint._4_4_ + -1));
    (**(code **)(gc_acc_twist_tf_ref_to_tgt + (long)iVar3 * 0x40))
              (piVar4,s.q + (joint._4_4_ + -1),s.x_tot + (joint._4_4_ + -1));
    gc_twist_tf_ref_to_tgt
              (s.x_jnt + (joint._4_4_ + -1),s.xd_tf + (joint._4_4_ + -1),
               s.xd_jnt + (joint._4_4_ + -1));
    gc_twist_accumulate(s.xd_jnt + (joint._4_4_ + -1),s.x_tot + (joint._4_4_ + -1),
                        s.xd_tf + joint._4_4_);
    (**(code **)(&two_dof_robot_c + (long)iVar3 * 0x40))
              (piVar4,s.xd_tf + joint._4_4_,s.q + (joint._4_4_ + -1),s.xdd_jnt + (joint._4_4_ + -1))
    ;
    mc_rbi_to_abi((long)s.tau_ctrl[1] + (long)(joint._4_4_ + -1) * 0x90 + 0x28,
                  s.qdd + (long)joint._4_4_ * 0x1b);
    mc_rbi_map_twist_to_momentum
              ((long)s.tau_ctrl[1] + (long)(joint._4_4_ + -1) * 0x90 + 0x28,s.xd_tf + joint._4_4_,
               s.d + (long)(joint._4_4_ + -1) * 2);
    mc_momentum_derive(s.xd_tf + joint._4_4_,s.d + (long)(joint._4_4_ + -1) * 2,s.p + joint._4_4_);
    mc_wrench_invert(s.tau_ff_art + (long)(joint._4_4_ + -1) * 2,s.f_ext + joint._4_4_,1);
  }
  for (joint_1._0_4_ = local_148; 0 < (int)joint_1; joint_1._0_4_ = (int)joint_1 + -1) {
    piVar4 = (int *)((long)s.tau_ctrl[1] + (long)((int)joint_1 + -1) * 0x90 + 0x10);
    iVar3 = *piVar4;
    (**(code **)(ga_pose_compose + (long)iVar3 * 0x40))
              (piVar4,s.qdd + (long)(int)joint_1 * 0x1b,s.m_art + ((int)joint_1 + -1));
    mc_abi_tf_tgt_to_ref
              (s.x_jnt + ((int)joint_1 + -1),s.m_art + ((int)joint_1 + -1),s.m_app + (int)joint_1);
    mc_abi_add(s.qdd + (long)((int)joint_1 + -1) * 0x1b,s.m_app + (int)joint_1,
               s.qdd + (long)((int)joint_1 + -1) * 0x1b);
    mc_abi_map_acc_twist_to_wrench
              (s.qdd + (long)(int)joint_1 * 0x1b,s.xdd_jnt + ((int)joint_1 + -1),
               s.f_bias_art + ((int)joint_1 + -1));
    mc_wrench_add(s.f_bias_art + ((int)joint_1 + -1),s.p + (int)joint_1,
                  s.f_bias_art + ((int)joint_1 + -1),1);
    (**(code **)(mc_abi_map_acc_twist_to_wrench + (long)iVar3 * 0x40))
              (piVar4,s.qdd + (long)(int)joint_1 * 0x1b,s.f_bias_art + ((int)joint_1 + -1),
               s.f_bias_eom + ((int)joint_1 + -1),1);
    mc_wrench_tf_tgt_to_ref
              (s.x_jnt + ((int)joint_1 + -1),s.f_bias_eom + ((int)joint_1 + -1),
               s.f_bias_app + ((int)joint_1 + -1),1);
    mc_wrench_add(s.p + ((int)joint_1 + -1),s.f_bias_app + ((int)joint_1 + -1),
                  s.p + ((int)joint_1 + -1),1);
    (**(code **)(gc_acc_twist_accumulate + (long)iVar3 * 0x40))
              (piVar4,s.qdd + (long)(int)joint_1 * 0x1b,s.tau_bias_art + ((int)joint_1 + -1),
               s.f_ff_app + ((int)joint_1 + -1),1);
    (**(code **)(mc_abi_map_acc_twist_to_wrench + (long)iVar3 * 0x40))
              (piVar4,s.qdd + (long)(int)joint_1 * 0x1b,s.tau_ff + (long)(int)joint_1 * 2,
               s.f_ff_art + ((int)joint_1 + -1),1);
    mc_wrench_add(s.f_ff_art + ((int)joint_1 + -1),s.f_ff_app + ((int)joint_1 + -1),
                  s.f_ff_art + ((int)joint_1 + -1),1);
    mc_wrench_tf_tgt_to_ref
              (s.x_jnt + ((int)joint_1 + -1),s.f_ff_art + ((int)joint_1 + -1),
               s.tau_ff + (long)((int)joint_1 + -1) * 2,1);
    (**(code **)(mc_abi_map_acc_twist_to_wrench + (long)iVar3 * 0x40))
              (piVar4,s.qdd + (long)(int)joint_1 * 0x1b,s.f_ext + (int)joint_1,
               s.f_ext_art + ((int)joint_1 + -1),1);
    mc_wrench_tf_tgt_to_ref
              (s.x_jnt + ((int)joint_1 + -1),s.f_ext_art + ((int)joint_1 + -1),
               s.f_ext_app + ((int)joint_1 + -1),1);
    mc_wrench_add(s.f_ext + ((int)joint_1 + -1),s.f_ext_app + ((int)joint_1 + -1),
                  s.f_ext + ((int)joint_1 + -1),1);
  }
  mc_abi_log(s.qdd);
  mc_wrench_log(s.p,1);
  mc_wrench_log(s.tau_ff,1);
  mc_wrench_log(s.f_ext,1);
  for (joint_2._0_4_ = 1; (int)joint_2 < local_148 + 1; joint_2._0_4_ = (int)joint_2 + 1) {
    lVar5 = (long)s.tau_ctrl[1] + (long)((int)joint_2 + -1) * 0x90;
    piVar4 = (int *)(lVar5 + 0x10);
    iVar3 = *piVar4;
    gc_acc_twist_tf_ref_to_tgt
              (s.x_jnt + ((int)joint_2 + -1),s.xdd_nact + ((int)joint_2 + -1),
               s.xdd_net + ((int)joint_2 + -1));
    gc_acc_twist_accumulate
              (s.xdd_net + ((int)joint_2 + -1),s.xdd_jnt + ((int)joint_2 + -1),
               s.xdd_tf + ((int)joint_2 + -1));
    mc_abi_map_acc_twist_to_wrench
              (s.qdd + (long)(int)joint_2 * 0x1b,s.xdd_tf + ((int)joint_2 + -1),
               s.f_bias_tf + ((int)joint_2 + -1));
    (**(code **)(kca_ifk + (long)iVar3 * 0x40))
              (piVar4,s.f_bias_tf + ((int)joint_2 + -1),
               &(s.f_bias_nact)->torque + ((int)joint_2 + -1),1);
    (**(code **)(kca_ifk + (long)iVar3 * 0x40))
              (piVar4,s.tau_ff + (long)(int)joint_2 * 2,&(s.f_ff_jnt)->torque + ((int)joint_2 + -1),
               1);
    (**(code **)(kca_ifk + (long)iVar3 * 0x40))
              (piVar4,s.f_ext + (int)joint_2,&(s.f_ext_tf)->torque + ((int)joint_2 + -1),1);
    dVar1 = s.qdd[(long)(int)joint_2 * 0x1b +
                  (long)*(int *)(lVar5 + 0x18) * 3 + (long)*(int *)(lVar5 + 0x18) + 0x12];
    dVar2 = **(double **)(lVar5 + 0x20);
    s.tau_ext_art[(int)joint_2 + -1] =
         ((s.tau_bias_art[(int)joint_2 + -1] - (double)(&(s.f_ff_jnt)->torque)[(int)joint_2 + -1]) -
         (double)(&(s.f_bias_nact)->torque)[(int)joint_2 + -1]) -
         (double)(&(s.f_ext_tf)->torque)[(int)joint_2 + -1];
    s.qd[(int)joint_2 + -1] = s.tau_ext_art[(int)joint_2 + -1] / (dVar1 + dVar2);
    (**(code **)(&two_dof_robot_a + (long)iVar3 * 0x40))
              (piVar4,s.qd + ((int)joint_2 + -1),s.xd + ((int)joint_2 + -1));
    gc_acc_twist_add(s.xd + ((int)joint_2 + -1),s.xdd_jnt + ((int)joint_2 + -1),
                     s.xdd_bias + ((int)joint_2 + -1));
    gc_acc_twist_accumulate
              (s.xdd_net + ((int)joint_2 + -1),s.xdd_bias + ((int)joint_2 + -1),
               s.xdd_nact + (int)joint_2);
  }
  gc_acc_twist_log(s.xdd_nact + local_148);
  return;
}

Assistant:

void aba_c()
{
    struct kcc_kinematic_chain *kc = &two_dof_robot_c;
    struct solver_state_c s;

    setup_simple_state_c(kc, &s);

    s.q[0] = 1.0;
    s.q[1] = 1.0;
    s.qd[0] = 1.0;
    s.qd[1] = 1.0;
    s.f_ext[s.nbody - 1].force[0].x = 1.0;
    s.f_ext[s.nbody - 1].force[0].y = 1.0;
    s.f_ext[s.nbody - 1].force[0].z = 1.0;
    s.tau_ff[0] = 1.0;
    s.tau_ff[1] = 1.0;
    s.xdd->linear_acceleration[0].z = 9.81;


    for (int i = 1; i < s.nbody + 1; i++) {
        struct kcc_joint *joint = &kc->segment[i - 1].joint;
        int joint_type = joint->type;

        // Position
        //

        // X_{J,i}
        kcc_joint[joint_type].fpk(joint, &s.q[i - 1], &s.x_jnt[i - 1]);

        // i^X_{i-1} = X_{J,i} X_{T,i}
        gc_pose_compose(&s.x_jnt[i - 1], &kc->segment[i - 1].joint_attachment, &s.x_rel[i - 1]);


        // Velocity
        //

        // Xd_{J,i} = S qd
        kcc_joint[joint_type].fvk(joint, &s.qd[i - 1], &s.xd_jnt[i - 1]);

        // Xd_{i-1}' = i^X_{i-1} Xd_{i-1}
        gc_twist_tf_ref_to_tgt(&s.x_rel[i - 1], &s.xd[i - 1], &s.xd_tf[i - 1]);

        // Xd_i = Xd_{i-1}' + Xd_{J,i}
        gc_twist_accumulate(&s.xd_tf[i - 1], &s.xd_jnt[i - 1], &s.xd[i]);


        // Acceleration
        //

        // Xdd_{bias,i} = S_i qdd_i + Sd_i qd_i + Xd_i x S_i qd_i
        kcc_joint[joint_type].inertial_acceleration(joint, &s.xd[i], &s.qd[i - 1], &s.xdd_bias[i - 1]);


        // Inertia
        //

        // M_i^A = M_i
        mc_rbi_to_abi(&kc->segment[i - 1].link.inertia, &s.m_art[i]);


        // Force
        //

        // P_i = M_i Xd_i
        mc_rbi_map_twist_to_momentum(&kc->segment[i - 1].link.inertia, &s.xd[i], &s.p[i - 1]);

        // F_{bias,i}^A = Xd_i x* P_i
        mc_momentum_derive(&s.xd[i], &s.p[i - 1], &s.f_bias_art[i]);


        // F_{ext,i}^A = -F_{ext,i}
        mc_wrench_invert(&s.f_ext[i - 1], &s.f_ext_art[i], 1);
    }


    for (int i = s.nbody; i > 0; i--) {
        struct kcc_joint *joint = &kc->segment[i - 1].joint;
        int joint_type = joint->type;

        // Inertia
        //

        // M_i^a = P_i^T M_i^A
        kcc_joint[joint_type].project_inertia(joint, &s.m_art[i], &s.m_app[i - 1]);

        // M_{i-1}^a' = {i-1}^X_i* M_i^a i^X_{i-1}
        mc_abi_tf_tgt_to_ref(&s.x_rel[i - 1], &s.m_app[i - 1], &s.m_tf[i]);

        // M_{i-1}^A += M_{i-1}^a'
        mc_abi_add(&s.m_art[i - 1], &s.m_tf[i], &s.m_art[i - 1]);


        // Force
        //

        // F_{bias,i}^A' = M_i^A Xdd_{bias,i}
        mc_abi_map_acc_twist_to_wrench(&s.m_art[i], &s.xdd_bias[i - 1], &s.f_bias_eom[i - 1]);

        // F_{bias,i}^A' += F_{bias,i}^A
        mc_wrench_add(&s.f_bias_eom[i - 1], &s.f_bias_art[i], &s.f_bias_eom[i - 1], 1);

        // F_{bias,i}^a = P_i^T F_{bias,i}^A'
        kcc_joint[joint_type].project_wrench(joint, &s.m_art[i], &s.f_bias_eom[i - 1], &s.f_bias_app[i - 1], 1);

        // F_{bias,i}^a' = {i-1}^X_i* F_{bias,i}^a
        mc_wrench_tf_tgt_to_ref(&s.x_rel[i - 1], &s.f_bias_app[i - 1], &s.f_bias_tf[i - 1], 1);

        // F_{bias,i-1}^A += F_{bias,i}^a'
        mc_wrench_add(&s.f_bias_art[i - 1], &s.f_bias_tf[i - 1], &s.f_bias_art[i - 1], 1);


        // F_{tau,i} = M_i^A S_i D^{-1} tau_{ff,i}
        kcc_joint[joint_type].ffd(joint, &s.m_art[i], &s.tau_ff[i - 1], &s.f_ff_jnt[i - 1], 1);

        // F_{tau,i}^a = P_i^T F_{tau,i}^A
        kcc_joint[joint_type].project_wrench(joint, &s.m_art[i], &s.f_ff_art[i], &s.f_ff_app[i - 1], 1);

        // F_{tau,i}^a += F_{tau,i}'
        mc_wrench_add(&s.f_ff_app[i - 1], &s.f_ff_jnt[i - 1], &s.f_ff_app[i - 1], 1);

        // F_{tau,i-1}^A = {i-1}^X_i* F_{tau,i}^a
        mc_wrench_tf_tgt_to_ref(&s.x_rel[i - 1], &s.f_ff_app[i - 1], &s.f_ff_art[i - 1], 1);


        // F_{ext,i}^a = P_i^T F_{ext,i}^A
        kcc_joint[joint_type].project_wrench(joint, &s.m_art[i], &s.f_ext_art[i], &s.f_ext_app[i - 1], 1);

        // F_{ext,i}^a' = {i-1}^X_i* F_{ext,i}^a
        mc_wrench_tf_tgt_to_ref(&s.x_rel[i - 1], &s.f_ext_app[i - 1], &s.f_ext_tf[i - 1], 1);

        // F_{ext,i-1}^A += F_{ext,i}^a'
        mc_wrench_add(&s.f_ext_art[i - 1], &s.f_ext_tf[i - 1], &s.f_ext_art[i - 1], 1);
    }

    mc_abi_log(&s.m_art[0]);
    mc_wrench_log(&s.f_bias_art[0], 1);
    mc_wrench_log(&s.f_ff_art[0], 1);
    mc_wrench_log(&s.f_ext_art[0], 1);


    for (int i = 1; i < s.nbody + 1; i++) {
        struct kcc_joint *joint = &kc->segment[i - 1].joint;
        int joint_type = joint->type;

        // Acceleration
        //

        // Xdd_{i-1}' = i^X_{i-1} Xdd_{i-1}
        gc_acc_twist_tf_ref_to_tgt(&s.x_rel[i - 1], &s.xdd[i - 1], &s.xdd_tf[i - 1]);

        // Xdd_{nact,i-1} = Xdd_{i-1}' + Xdd_{bias,i-1}
        gc_acc_twist_accumulate(&s.xdd_tf[i - 1], &s.xdd_bias[i - 1], &s.xdd_nact[i - 1]);


        // Force
        //

        // F_{nact,i} = M_i^A Xdd_{nact,i-1}'
        mc_abi_map_acc_twist_to_wrench(&s.m_art[i], &s.xdd_nact[i - 1], &s.f_bias_nact[i - 1]);

        // tau_{bias,i}^A = S^T F_{bias,i}
        kcc_joint[joint_type].ifk(joint, &s.f_bias_nact[i - 1], &s.tau_bias_art[i - 1], 1);


        // tau_{ff,i}^A = S^T F_{ff,i}
        kcc_joint[joint_type].ifk(joint, &s.f_ff_art[i], &s.tau_ff_art[i - 1], 1);


        // tau_{ext,i}^A = S^T F_{ext,i}
        kcc_joint[joint_type].ifk(joint, &s.f_ext_art[i], &s.tau_ext_art[i - 1], 1);


        // Solve
        //
        int k = joint->revolute_joint.axis;
        double d = s.m_art[i].second_moment_of_mass.row[k].data[k] + joint->revolute_joint.inertia[0];
        s.tau_ctrl[i - 1] = s.tau_ff[i - 1] - s.tau_ff_art[i - 1] - s.tau_bias_art[i - 1] - s.tau_ext_art[i - 1];
        s.qdd[i - 1] = s.tau_ctrl[i - 1] / d;


        // Resultant acceleration
        //

        // Xdd_{J,i} = S_i qdd_i
        kcc_joint[joint_type].fak(joint, &s.qdd[i - 1], &s.xdd_jnt[i - 1]);

        // Xdd_{J,i}' = Xdd_{J,i} + Xdd_{bias,i}
        gc_acc_twist_add(&s.xdd_jnt[i - 1], &s.xdd_bias[i - 1], &s.xdd_net[i - 1]);

        // Xdd_i = Xdd_{i-1}' + Xdd_{J,i}'
        gc_acc_twist_accumulate(&s.xdd_tf[i - 1], &s.xdd_net[i - 1], &s.xdd[i]);
    }

    gc_acc_twist_log(&s.xdd[s.nbody]);
}